

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O0

void __thiscall
embree::ISPCQuadMesh::ISPCQuadMesh
          (ISPCQuadMesh *this,RTCDevice device,TutorialScene *scene_in,
          Ref<embree::SceneGraph::QuadMeshNode> *in)

{
  long *plVar1;
  long lVar2;
  ulong uVar3;
  ISPCType IVar4;
  uint uVar5;
  RTCGeometry pRVar6;
  void *pvVar7;
  size_t sVar8;
  Vec3fa *pVVar9;
  size_type sVar10;
  Vec2<float> *pVVar11;
  Quad *pQVar12;
  long *in_RCX;
  undefined8 in_RSI;
  ISPCGeometry *in_RDI;
  size_t i_1;
  size_t i;
  QuadMeshNode *in_stack_fffffffffffffde8;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
  *in_stack_fffffffffffffe00;
  long *local_e0;
  ulong local_d8;
  ulong local_d0;
  undefined8 local_a8;
  long *local_98;
  long **local_90;
  long **local_88;
  
  local_a8 = in_RSI;
  ISPCGeometry::ISPCGeometry(in_RDI,QUAD_MESH);
  *(undefined8 *)(in_RDI + 1) = 0;
  in_RDI[1].geometry = (RTCGeometry)0x0;
  pRVar6 = (RTCGeometry)rtcNewGeometry(local_a8,1);
  in_RDI->geometry = pRVar6;
  SceneGraph::QuadMeshNode::numTimeSteps((QuadMeshNode *)0x1acccc);
  pvVar7 = alignedUSMMalloc((size_t)in_stack_fffffffffffffdf0,(size_t)in_stack_fffffffffffffde8,
                            DEFAULT);
  *(void **)(in_RDI + 1) = pvVar7;
  for (local_d0 = 0; uVar3 = local_d0,
      sVar8 = SceneGraph::QuadMeshNode::numTimeSteps((QuadMeshNode *)0x1acd5b), uVar3 < sVar8;
      local_d0 = local_d0 + 1) {
    std::
    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  *)(*in_RCX + 0x70),local_d0);
    pVVar9 = copyArrayToUSM<embree::Vec3fa>((avector<embree::Vec3fa> *)in_stack_fffffffffffffde8);
    *(Vec3fa **)(*(long *)(in_RDI + 1) + local_d0 * 8) = pVVar9;
  }
  sVar10 = std::
           vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ::size((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                   *)(*in_RCX + 0x88));
  if (sVar10 != 0) {
    SceneGraph::QuadMeshNode::numTimeSteps((QuadMeshNode *)0x1ace8f);
    pRVar6 = (RTCGeometry)
             alignedUSMMalloc((size_t)in_stack_fffffffffffffdf0,(size_t)in_stack_fffffffffffffde8,
                              DEFAULT);
    in_RDI[1].geometry = pRVar6;
    for (local_d8 = 0; uVar3 = local_d8,
        sVar8 = SceneGraph::QuadMeshNode::numTimeSteps((QuadMeshNode *)0x1acf1e), uVar3 < sVar8;
        local_d8 = local_d8 + 1) {
      std::
      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    *)(*in_RCX + 0x88),local_d8);
      pVVar9 = copyArrayToUSM<embree::Vec3fa>((avector<embree::Vec3fa> *)in_stack_fffffffffffffde8);
      *(Vec3fa **)(in_RDI[1].geometry + local_d8 * 8) = pVVar9;
    }
  }
  pVVar11 = copyArrayToUSM<embree::Vec2<float>>
                      ((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)
                       in_stack_fffffffffffffe00);
  *(Vec2<float> **)&in_RDI[1].materialID = pVVar11;
  pQVar12 = copyArrayToUSM<embree::SceneGraph::QuadMeshNode::Quad>(in_stack_fffffffffffffe00);
  *(Quad **)(in_RDI + 2) = pQVar12;
  *(undefined4 *)&in_RDI[2].geometry = *(undefined4 *)(*in_RCX + 0x68);
  *(undefined4 *)((long)&in_RDI[2].geometry + 4) = *(undefined4 *)(*in_RCX + 0x6c);
  sVar8 = SceneGraph::QuadMeshNode::numTimeSteps((QuadMeshNode *)0x1ad103);
  in_RDI[2].materialID = (uint)sVar8;
  sVar8 = SceneGraph::QuadMeshNode::numVertices(in_stack_fffffffffffffde8);
  *(int *)&in_RDI[2].visited = (int)sVar8;
  IVar4 = (**(code **)(*(long *)*in_RCX + 0x70))();
  in_RDI[3].type = IVar4;
  local_98 = (long *)(*in_RCX + 0xd0);
  local_90 = &local_e0;
  plVar1 = (long *)*local_98;
  if (plVar1 != (long *)0x0) {
    lVar2 = *local_e0;
    local_e0 = plVar1;
    (**(code **)(lVar2 + 0x10))();
    plVar1 = local_e0;
  }
  local_e0 = plVar1;
  uVar5 = TutorialScene::materialID
                    ((TutorialScene *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                     in_stack_fffffffffffffdf0);
  in_RDI->materialID = uVar5;
  local_88 = &local_e0;
  if (local_e0 != (long *)0x0) {
    (**(code **)(*local_e0 + 0x18))();
  }
  return;
}

Assistant:

ISPCQuadMesh::ISPCQuadMesh (RTCDevice device, TutorialScene* scene_in, Ref<SceneGraph::QuadMeshNode> in) 
    : geom(QUAD_MESH), positions(nullptr), normals(nullptr)
  {
    geom.geometry = rtcNewGeometry (device, RTC_GEOMETRY_TYPE_QUAD);
    
    positions = (Vec3fa**) alignedUSMMalloc(sizeof(Vec3fa*)*in->numTimeSteps());
    for (size_t i=0; i<in->numTimeSteps(); i++)
      positions[i] = copyArrayToUSM(in->positions[i]);

    if (in->normals.size()) {
      normals = (Vec3fa**) alignedUSMMalloc(sizeof(Vec3fa*)*in->numTimeSteps());
      for (size_t i=0; i<in->numTimeSteps(); i++)
        normals[i] = copyArrayToUSM(in->normals[i]);
    }
    
    texcoords = copyArrayToUSM(in->texcoords);
    quads = (ISPCQuad*) copyArrayToUSM(in->quads);
    startTime = in->time_range.lower;
    endTime   = in->time_range.upper;
    numTimeSteps = (unsigned) in->numTimeSteps();
    numVertices = (unsigned) in->numVertices();
    numQuads = (unsigned) in->numPrimitives();
    geom.materialID = scene_in->materialID(in->material);
  }